

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_slow(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  int in_stack_00000194;
  CHAR_DATA *in_stack_00000198;
  CHAR_DATA *in_stack_000001a0;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *arg2;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char_data *in_stack_ffffffffffffff80;
  
  char_data::Class(in_stack_ffffffffffffff80);
  bVar1 = RString::operator==((RString *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (char *)in_stack_ffffffffffffff68);
  if ((bVar1) && (in_RCX != in_RDX)) {
    send_to_char((char *)in_stack_ffffffffffffff80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    bVar1 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
    if (!bVar1) {
      bVar1 = is_affected(in_RCX,in_EDI);
      if ((bVar1) ||
         (bVar1 = is_affected_by((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                 in_stack_ffffffffffffff74), bVar1)) {
        if (in_RCX == in_RDX) {
          send_to_char((char *)in_stack_ffffffffffffff80,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
        else {
          act((char *)in_stack_ffffffffffffff80,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              in_stack_ffffffffffffff68,0);
        }
      }
      else {
        bVar1 = is_affected_by((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               in_stack_ffffffffffffff74);
        if (bVar1) {
          arg2 = in_RCX;
          skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          affect_strip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          bVar1 = is_affected_by((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                 in_stack_ffffffffffffff74);
          if (bVar1) {
            _Var2 = std::pow<int,int>(0,0x61ac75);
            in_RCX->affected_by[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & in_RCX->affected_by[0];
          }
          send_to_char((char *)in_stack_ffffffffffffff80,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          act((char *)in_stack_ffffffffffffff80,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),arg2,0);
        }
        else {
          init_affect((AFFECT_DATA *)0x61accc);
          std::pow<int,int>(0,0x61ad5f);
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (AFFECT_DATA *)in_stack_ffffffffffffff68);
          send_to_char((char *)in_stack_ffffffffffffff80,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          act((char *)in_stack_ffffffffffffff80,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
              (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              in_stack_ffffffffffffff68,0);
          bVar1 = trusts((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
          ;
          if (!bVar1) {
            multi_hit(in_stack_000001a0,in_stack_00000198,in_stack_00000194);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spell_slow(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (ch->Class()->name == "assassin" && victim != ch)
	{
		send_to_char("You are only able to slow your own metabolism.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (is_affected(victim, sn) || is_affected_by(victim, AFF_SLOW))
	{
		if (victim == ch)
			send_to_char("You can't move any slower!\n\r", ch);
		else
			act("$N can't get any slower than that.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	if (is_affected_by(victim, AFF_HASTE))
	{
		affect_strip(victim, skill_lookup("haste"));

		if (is_affected_by(victim, AFF_HASTE))
			REMOVE_BIT(victim->affected_by, AFF_HASTE);

		send_to_char("You start moving at normal speed again.\n\r", victim);
		act("$n starts moving at normal speed again.", victim, nullptr, nullptr, TO_ROOM);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level / 4;
	af.location = APPLY_DEX;
	af.modifier = -1 - (level >= 18) - (level >= 25) - (level >= 32);

	SET_BIT(af.bitvector, AFF_SLOW);

	af.mod_name = MOD_SPEED;
	affect_to_char(victim, &af);

	send_to_char("You feel yourself moving more slowly.\n\r", victim);
	act("$n is moving more slowly.", victim, nullptr, nullptr, TO_ROOM);

	if (!trusts(ch, victim))
		multi_hit(victim, ch, TYPE_UNDEFINED);
}